

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution_environment_common.cpp
# Opt level: O1

LCC_API_VIRTUALIZATION_DETAIL
license::os::find_in_map
          (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
           *map,string *data)

{
  long lVar1;
  LCC_API_VIRTUALIZATION_DETAIL unaff_EBP;
  __node_base *p_Var2;
  value_type it;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  LCC_API_VIRTUALIZATION_DETAIL local_38;
  
  p_Var2 = &(map->_M_h)._M_before_begin;
  do {
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) {
      return BARE_TO_METAL;
    }
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,p_Var2[1]._M_nxt,
               (long)&(p_Var2[1]._M_nxt)->_M_nxt +
               (long)&(*(_Hash_node_base **)
                        &((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor)->_M_nxt);
    local_38 = *(LCC_API_VIRTUALIZATION_DETAIL *)&p_Var2[5]._M_nxt;
    lVar1 = std::__cxx11::string::find((char *)data,(ulong)local_58[0],0);
    if (lVar1 != -1) {
      unaff_EBP = local_38;
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
  } while (lVar1 == -1);
  return unaff_EBP;
}

Assistant:

static LCC_API_VIRTUALIZATION_DETAIL find_in_map(const unordered_map<string, LCC_API_VIRTUALIZATION_DETAIL>& map,
												 const string& data) {
	for (auto it : map) {
		if (data.find(it.first) != string::npos) {
			return it.second;
		}
	}
	return BARE_TO_METAL;
}